

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void beta_values(int *n_data,double *x,double *y,double *fxy)

{
  uint uVar1;
  
  uVar1 = *n_data;
  if ((int)uVar1 < 0) {
    uVar1 = 0;
  }
  else if (0x10 < uVar1) {
    *n_data = 0;
    *x = 0.0;
    *y = 0.0;
    *fxy = 0.0;
    return;
  }
  *x = (double)(&DAT_00226270)[uVar1];
  *y = (double)(&DAT_00226300)[uVar1];
  *fxy = (double)(&DAT_002261e0)[uVar1];
  *n_data = uVar1 + 1;
  return;
}

Assistant:

void beta_values ( int *n_data, double *x, double *y, double *fxy )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_VALUES returns some values of the Beta function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and
//    N_DATA is set to the index of the test data.  On each subsequent
//    call, N_DATA is incremented and that test data is returned.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, double *X, *Y, the arguments of the function.
//
//    Output, double *FXY, the value of the function.
//
{
# define N_MAX 17

  double b_vec[N_MAX] = {
    5.000000, 2.500000, 1.666667, 1.250000, 
    5.000000, 2.500000, 1.000000, 1.666667E-01, 
    0.333333E-01, 7.142857E-03, 1.587302E-03, 0.238095E-01, 
    5.952381E-03, 1.984127E-03, 7.936508E-04, 3.607504E-04, 
    8.325008E-05 };

  double x_vec[N_MAX] = {
    0.2, 0.4, 0.6, 0.8, 
    1.0, 1.0, 1.0, 2.0, 
    3.0, 4.0, 5.0, 6.0, 
    6.0, 6.0, 6.0, 6.0, 
    7.0 };

  double y_vec[N_MAX] = {
    1.0, 1.0, 1.0, 1.0, 
    0.2, 0.4, 1.0, 2.0, 
    3.0, 4.0, 5.0, 2.0, 
    3.0, 4.0, 5.0, 6.0, 
    7.0 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }
  
  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *x = 0.0;
    *y = 0.0;
    *fxy = 0.0;
  }
  else
  {
    *x = x_vec[*n_data];
    *y = y_vec[*n_data];
    *fxy = b_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}